

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int aes_init(aes_context *ctx,uint8_t *key,int bits)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong local_40;
  size_t i_1;
  size_t i;
  uint32_t *ekey;
  int bits_local;
  uint8_t *key_local;
  aes_context *ctx_local;
  
  if (bits == 0x80) {
    ctx->nr = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    ctx->nr = 0xe;
  }
  iVar2 = aes_supported_x86();
  if (iVar2 == 0) {
    i = (size_t)ctx->key;
    if (bits == 0x80) {
      uVar3 = get32be(key);
      *(uint32_t *)i = uVar3;
      uVar3 = get32be(key + 4);
      ctx->key[1] = uVar3;
      uVar3 = get32be(key + 8);
      ctx->key[2] = uVar3;
      uVar3 = get32be(key + 0xc);
      ctx->key[3] = uVar3;
      for (i_1 = 0; i_1 < 10; i_1 = i_1 + 1) {
        uVar1 = *(uint *)i;
        uVar3 = setup_mix(*(uint32_t *)(i + 0xc));
        *(uint *)(i + 0x10) = uVar1 ^ uVar3 ^ (uint)rcon[i_1] << 0x18;
        *(uint *)(i + 0x14) = *(uint *)(i + 4) ^ *(uint *)(i + 0x10);
        *(uint *)(i + 0x18) = *(uint *)(i + 8) ^ *(uint *)(i + 0x14);
        *(uint *)(i + 0x1c) = *(uint *)(i + 0xc) ^ *(uint *)(i + 0x18);
        i = i + 0x10;
      }
    }
    else if (bits == 0x100) {
      uVar3 = get32be(key);
      *(uint32_t *)i = uVar3;
      uVar3 = get32be(key + 4);
      ctx->key[1] = uVar3;
      uVar3 = get32be(key + 8);
      ctx->key[2] = uVar3;
      uVar3 = get32be(key + 0xc);
      ctx->key[3] = uVar3;
      uVar3 = get32be(key + 0x10);
      ctx->key[4] = uVar3;
      uVar3 = get32be(key + 0x14);
      ctx->key[5] = uVar3;
      uVar3 = get32be(key + 0x18);
      ctx->key[6] = uVar3;
      uVar3 = get32be(key + 0x1c);
      ctx->key[7] = uVar3;
      for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
        uVar1 = *(uint *)i;
        uVar3 = setup_mix(*(uint32_t *)(i + 0x1c));
        *(uint *)(i + 0x20) = uVar1 ^ uVar3 ^ (uint)rcon[local_40] << 0x18;
        *(uint *)(i + 0x24) = *(uint *)(i + 4) ^ *(uint *)(i + 0x20);
        *(uint *)(i + 0x28) = *(uint *)(i + 8) ^ *(uint *)(i + 0x24);
        *(uint *)(i + 0x2c) = *(uint *)(i + 0xc) ^ *(uint *)(i + 0x28);
        uVar1 = *(uint *)(i + 0x10);
        uVar3 = setup_mix3(*(uint32_t *)(i + 0x2c));
        *(uint *)(i + 0x30) = uVar1 ^ uVar3;
        *(uint *)(i + 0x34) = *(uint *)(i + 0x14) ^ *(uint *)(i + 0x30);
        *(uint *)(i + 0x38) = *(uint *)(i + 0x18) ^ *(uint *)(i + 0x34);
        *(uint *)(i + 0x3c) = *(uint *)(i + 0x1c) ^ *(uint *)(i + 0x38);
        i = i + 0x20;
      }
    }
  }
  else {
    aes_init_x86(ctx,key);
  }
  return 0;
}

Assistant:

int aes_init(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_x86(ctx, key);
        return 0;
    }
#endif

    uint32_t* ekey = ctx->key;
    switch(bits) {
        case 128:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);

            for (size_t i=0; i<10; i++)
            {
                ekey[4] = ekey[0] ^ setup_mix(ekey[3]) ^ (rcon[i] << 24);
                ekey[5] = ekey[1] ^ ekey[4];
                ekey[6] = ekey[2] ^ ekey[5];
                ekey[7] = ekey[3] ^ ekey[6];
                ekey += 4;
            }
            break;
        case 256:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);
            ekey[4] = get32be(key + 16);
            ekey[5] = get32be(key + 20);
            ekey[6] = get32be(key + 24);
            ekey[7] = get32be(key + 28);

            for (size_t i=0; i<7; i++)
            {
                ekey[8]  = ekey[0] ^ setup_mix(ekey[7]) ^ (rcon[i] << 24);
                ekey[9]  = ekey[1] ^ ekey[8];
                ekey[10] = ekey[2] ^ ekey[9];
                ekey[11] = ekey[3] ^ ekey[10];
                ekey[12] = ekey[4] ^ setup_mix3(ekey[11]);
                ekey[13] = ekey[5] ^ ekey[12];
                ekey[14] = ekey[6] ^ ekey[13];
                ekey[15] = ekey[7] ^ ekey[14];
                ekey += 8;
            }
            break;
    }

    return 0;
}